

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ImportEnumerator.cpp
# Opt level: O2

bool axl::spy::enumerateImports(ImportIterator *iterator,void *module)

{
  Elf64_Dyn *pEVar1;
  ulong uVar2;
  ulong uVar3;
  ElfImportEnumeration *p;
  anon_union_8_2_f9000a74_for_d_un aVar4;
  int iVar5;
  undefined1 auVar6 [16];
  Ptr<axl::spy::ElfImportEnumeration> enumeration;
  ImportIterator local_1a8;
  Elf64_Dyn *dynTable [35];
  
  if (module == (void *)0x0) {
    module = _operator_delete;
  }
  memset(dynTable,0,0x118);
  for (pEVar1 = *(Elf64_Dyn **)((long)module + 0x10); uVar2 = pEVar1->d_tag, uVar2 != 0;
      pEVar1 = pEVar1 + 1) {
    if (uVar2 < 0x23) {
      dynTable[uVar2] = pEVar1;
    }
  }
  auVar6._0_4_ = -(uint)((int)((ulong)dynTable[6] >> 0x20) == 0 && (int)dynTable[6] == 0);
  auVar6._4_4_ = -(uint)((int)dynTable[0xb] == 0 && (int)((ulong)dynTable[0xb] >> 0x20) == 0);
  auVar6._8_4_ = -(uint)((int)((ulong)dynTable[5] >> 0x20) == 0 && (int)dynTable[5] == 0);
  auVar6._12_4_ = -(uint)((int)dynTable[10] == 0 && (int)((ulong)dynTable[10] >> 0x20) == 0);
  iVar5 = movmskps(0,auVar6);
  if ((((iVar5 == 0) && ((dynTable[7] == (Elf64_Dyn *)0x0) != (dynTable[8] != (Elf64_Dyn *)0x0))) &&
      ((dynTable[9] == (Elf64_Dyn *)0x0) == (dynTable[7] == (Elf64_Dyn *)0x0))) &&
     ((((dynTable[0x17] == (Elf64_Dyn *)0x0) != (dynTable[2] != (Elf64_Dyn *)0x0) &&
       ((dynTable[0xb]->d_un).d_val == 0x18)) &&
      ((dynTable[9] == (Elf64_Dyn *)0x0 || ((dynTable[9]->d_un).d_val == 0x18)))))) {
    if (dynTable[2] == (Elf64_Dyn *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (dynTable[2]->d_un).d_val / 0x18;
    }
    if (dynTable[8] == (Elf64_Dyn *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (dynTable[8]->d_un).d_val / 0x18;
    }
    if (uVar2 == 0 && uVar3 == 0) {
      local_1a8.super_ImportIteratorBase.m_symbolName.m_length._0_1_ = 0;
      local_1a8.super_ImportIteratorBase.m_symbolName._17_8_ = 0;
      local_1a8.super_ImportIteratorBase.m_symbolName.m_p = (C *)0x0;
      local_1a8.super_ImportIteratorBase.m_symbolName.m_hdr._0_1_ = 0;
      local_1a8.super_ImportIteratorBase.m_symbolName.m_hdr._1_7_ = 0;
      local_1a8.super_ImportIteratorBase.m_moduleName.m_p = (C *)0x0;
      local_1a8.super_ImportIteratorBase.m_moduleName.m_hdr._0_1_ = 0;
      local_1a8.super_ImportIteratorBase.m_moduleName.m_hdr._1_7_ = 0;
      local_1a8.super_ImportIteratorBase.m_moduleName.m_length._0_1_ = 0;
      local_1a8.super_ImportIteratorBase.m_moduleName._17_8_ = 0;
      local_1a8.m_enumeration.m_refCount = (RefCount *)0x0;
      local_1a8.super_ImportIteratorBase.m_slot = (void **)0x0;
      local_1a8.m_enumeration.m_p = (ElfImportEnumeration *)0x0;
      local_1a8.m_index = 0xffffffffffffffff;
      ImportIterator::operator=(iterator,&local_1a8);
      ImportIterator::~ImportIterator(&local_1a8);
    }
    else {
      p = (ElfImportEnumeration *)mem::allocate(0x58);
      (p->super_RefCount).m_refCount = 0;
      (p->super_RefCount).m_weakRefCount = 1;
      (p->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__RefCount_00198fb8;
      (p->super_RefCount).m_freeFunc = mem::deallocate;
      rc::Ptr<axl::spy::ElfImportEnumeration>::Ptr<axl::spy::ElfImportEnumeration>(&enumeration,p);
      (enumeration.m_p)->m_baseAddress = *module;
      (enumeration.m_p)->m_symbolTable = (Elf64_Sym *)dynTable[6]->d_un;
      (enumeration.m_p)->m_stringTable = (char *)dynTable[5]->d_un;
      (enumeration.m_p)->m_stringTableSize = (size_t)dynTable[10]->d_un;
      if (dynTable[0x17] == (Elf64_Dyn *)0x0) {
        aVar4.d_val = 0;
      }
      else {
        aVar4 = dynTable[0x17]->d_un;
      }
      (enumeration.m_p)->m_pltRelTable = (ElfRel *)aVar4;
      (enumeration.m_p)->m_pltRelCount = uVar2;
      if (dynTable[7] == (Elf64_Dyn *)0x0) {
        aVar4.d_val = 0;
      }
      else {
        aVar4 = dynTable[7]->d_un;
      }
      (enumeration.m_p)->m_gotRelTable = (ElfRel *)aVar4;
      (enumeration.m_p)->m_gotRelCount = uVar3;
      ImportIterator::ImportIterator(&local_1a8,enumeration.m_p);
      ImportIterator::operator=(iterator,&local_1a8);
      ImportIterator::~ImportIterator(&local_1a8);
      rc::Ptr<axl::spy::ElfImportEnumeration>::~Ptr(&enumeration);
    }
    return true;
  }
  err::ErrorRef::ErrorRef((ErrorRef *)&local_1a8,"invalid ELF (missing or bad section(s))");
  err::setError((ErrorRef *)&local_1a8);
  rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef
            ((BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *)&local_1a8);
  return false;
}

Assistant:

bool
enumerateImports(
	ImportIterator* iterator,
	void* module
) {
	link_map* linkMap = module ? (link_map*)module : _r_debug.r_map;

	ElfW(Dyn)* dynTable[DT_NUM] = { 0 };
	ElfW(Dyn)* dyn = linkMap->l_ld;
	for (; dyn->d_tag; dyn++)
		if (dyn->d_tag < countof(dynTable))
			dynTable[dyn->d_tag] = dyn;

	// sanity check

	if (!dynTable[DT_SYMTAB] ||
		!dynTable[DT_SYMENT] ||
		!dynTable[DT_STRTAB] ||
		!dynTable[DT_STRSZ] ||
		!dynTable[DT_GOT_REL] != !dynTable[DT_GOT_RELSZ] ||
		!dynTable[DT_GOT_REL] != !dynTable[DT_GOT_RELENT] ||
		!dynTable[DT_JMPREL] != !dynTable[DT_PLTRELSZ] ||
		dynTable[DT_SYMENT]->d_un.d_val != sizeof(ElfW(Sym)) ||
		dynTable[DT_GOT_RELENT] && dynTable[DT_GOT_RELENT]->d_un.d_val != sizeof(ElfRel)) {
		err::setError("invalid ELF (missing or bad section(s))");
		return false;
	}

	size_t pltRelCount = dynTable[DT_PLTRELSZ] ? dynTable[DT_PLTRELSZ]->d_un.d_val / sizeof(ElfRel) : 0;
	size_t gotRelCount = dynTable[DT_GOT_RELSZ] ? dynTable[DT_GOT_RELSZ]->d_un.d_val / sizeof(ElfRel) : 0;

	if (!pltRelCount && !gotRelCount) {
		*iterator = ImportIterator();
		return true;
	}

	rc::Ptr<ElfImportEnumeration> enumeration = AXL_RC_NEW(ElfImportEnumeration);
	enumeration->m_baseAddress = linkMap->l_addr;
	enumeration->m_symbolTable = (ElfW(Sym)*)dynTable[DT_SYMTAB]->d_un.d_ptr;
	enumeration->m_stringTable = (char*)dynTable[DT_STRTAB]->d_un.d_ptr;
	enumeration->m_stringTableSize = dynTable[DT_STRSZ]->d_un.d_val;
	enumeration->m_pltRelTable = dynTable[DT_JMPREL] ? (ElfRel*)dynTable[DT_JMPREL]->d_un.d_ptr : NULL;
	enumeration->m_pltRelCount = pltRelCount;
	enumeration->m_gotRelTable = dynTable[DT_GOT_REL] ? (ElfRel*)dynTable[DT_GOT_REL]->d_un.d_ptr : NULL;
	enumeration->m_gotRelCount = gotRelCount;

	*iterator = ImportIterator(enumeration);
	return true;
}